

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O1

cio_error cio_eventloop_run(cio_eventloop *loop)

{
  int iVar1;
  cio_event_notifier *evn;
  uint uVar2;
  long in_RAX;
  ulong uVar3;
  int *piVar4;
  cio_epoll_error cVar5;
  char cVar6;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  do {
    uVar2 = epoll_wait(loop->epoll_fd,(epoll_event *)loop->epoll_events,100,-1);
    if ((int)uVar2 < 0) {
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      if (iVar1 != 4) {
        uStack_38._4_4_ = -iVar1;
      }
      uStack_38 = (ulong)(uint)uStack_38._4_4_ << 0x20;
      cVar6 = (iVar1 == 4) + '\x01';
    }
    else {
      loop->num_events = uVar2;
      loop->event_counter = 0;
      if (uVar2 != 0) {
        uVar3 = 0;
        do {
          evn = (cio_event_notifier *)loop->epoll_events[uVar3].data.u64;
          if (evn == &loop->stop_ev) {
            cVar6 = '\a';
          }
          else {
            uVar2 = loop->epoll_events[uVar3].events;
            loop->current_ev = evn;
            if ((evn->registered_events & uVar2 & 1) != 0) {
              (*evn->read_callback)(evn->context,CIO_EPOLL_SUCCESS);
            }
            cVar6 = '\0';
            if ((loop->current_ev != (cio_event_notifier *)0x0) &&
               ((uVar2 & evn->registered_events & 4) != 0)) {
              cVar5 = CIO_EPOLL_SUCCESS;
              if ((uVar2 & 0x18) != 0) {
                cVar5 = CIO_EPOLL_ERROR;
              }
              uVar2 = evn->registered_events & 0xfffffffb;
              evn->registered_events = uVar2;
              epoll_mod(loop,evn,uVar2);
              (*evn->write_callback)(evn->context,cVar5);
              cVar6 = '\0';
            }
          }
          if (evn == &loop->stop_ev) goto LAB_00101cc9;
          uVar2 = loop->event_counter + 1;
          uVar3 = (ulong)uVar2;
          loop->event_counter = uVar2;
        } while (uVar2 < loop->num_events);
      }
      cVar6 = '\0';
    }
LAB_00101cc9:
    if ((cVar6 != '\0') && (cVar6 != '\x02')) {
      if (cVar6 == '\a') {
        uStack_38._4_4_ = CIO_SUCCESS;
      }
      else {
      }
      return uStack_38._4_4_;
    }
  } while( true );
}

Assistant:

enum cio_error cio_eventloop_run(struct cio_eventloop *loop)
{
	struct epoll_event *events = loop->epoll_events;

	while (true) {
		int num_events =
		    epoll_wait(loop->epoll_fd, events, CONFIG_MAX_EPOLL_EVENTS, -1);

		if (cio_unlikely(num_events < 0)) {
			if (errno == EINTR) {
				continue;
			}

			return (enum cio_error)(-errno);
		}

		loop->num_events = (unsigned int)num_events;
		for (loop->event_counter = 0; loop->event_counter < loop->num_events; loop->event_counter++) {
			struct cio_event_notifier *evn = events[loop->event_counter].data.ptr;
			if (cio_unlikely(evn == &loop->stop_ev)) {
				goto out;
			}

			uint32_t events_type = events[loop->event_counter].events;
			loop->current_ev = evn;

			if ((events_type & (uint32_t)EPOLLIN & evn->registered_events) != 0) {
				evn->read_callback(evn->context, CIO_EPOLL_SUCCESS);
			}

			handle_removed_ev(loop, evn, events_type);
		}
	}

out:
	return CIO_SUCCESS;
}